

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyImplPrivate::_q_copyReadyRead(QNetworkReplyImplPrivate *this)

{
  QNetworkReplyImpl *__u;
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  QNetworkReplyImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  optional<long_long> oVar5;
  qint64 bytesActuallyRead;
  qint64 lastBytesDownloaded;
  QNetworkReplyImpl *q;
  qint64 bytesToRead;
  optional<long_long> totalSizeOpt;
  QNetworkHeadersPrivate *in_stack_ffffffffffffff58;
  QRingBufferRef *in_stack_ffffffffffffff60;
  longlong *in_stack_ffffffffffffff68;
  optional<long_long> *this_00;
  QNetworkReplyImplPrivate *in_stack_ffffffffffffff70;
  long in_stack_ffffffffffffff90;
  storage_type *psVar6;
  QByteArrayView local_48;
  undefined8 local_30;
  undefined4 local_24;
  qint64 local_20;
  _Storage<long_long,_true> local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __u = q_func(in_RDI);
  if (((in_RDI->state == Working) && (in_RDI->copyDevice != (QIODevice *)0x0)) &&
     (uVar1 = QIODevice::isOpen(), (uVar1 & 1) != 0)) {
    psVar6 = (storage_type *)in_RDI->bytesDownloaded;
    while (local_20 = nextDownstreamBlockSize(in_stack_ffffffffffffff70), local_20 != 0) {
      local_24 = 1;
      local_30 = (**(code **)(*(long *)in_RDI->copyDevice + 0xa0))();
      local_20 = qBound<long_long,int>
                           ((int *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                            (longlong *)in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff70 = (QNetworkReplyImplPrivate *)in_RDI->copyDevice;
      pcVar2 = QIODevicePrivate::QRingBufferRef::reserve
                         (in_stack_ffffffffffffff60,(qint64)in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff90 =
           QIODevice::read((char *)in_stack_ffffffffffffff70,(longlong)pcVar2);
      if (in_stack_ffffffffffffff90 == -1) {
        QIODevicePrivate::QRingBufferRef::chop
                  (in_stack_ffffffffffffff60,(qint64)in_stack_ffffffffffffff58);
        goto LAB_001ea502;
      }
      QIODevicePrivate::QRingBufferRef::chop
                (in_stack_ffffffffffffff60,(qint64)in_stack_ffffffffffffff58);
      uVar1 = (**(code **)(*(long *)in_RDI->copyDevice + 0x60))();
      if (((uVar1 & 1) == 0) &&
         (uVar1 = (**(code **)(*(long *)in_RDI->copyDevice + 0x90))(), (uVar1 & 1) != 0)) {
        in_RDI->bytesDownloaded = in_stack_ffffffffffffff90 + in_RDI->bytesDownloaded;
        goto LAB_001ea502;
      }
      in_RDI->bytesDownloaded = in_stack_ffffffffffffff90 + in_RDI->bytesDownloaded;
    }
    local_20 = 0;
LAB_001ea502:
    if ((storage_type *)in_RDI->bytesDownloaded != psVar6) {
      local_18 = (_Storage<long_long,_true>)0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      QNetworkHeadersPrivate::headers(in_stack_ffffffffffffff58);
      QByteArrayView::QByteArrayView(&local_48);
      QVar4.m_data = psVar6;
      QVar4.m_size = in_stack_ffffffffffffff90;
      QVar4 = QHttpHeaders::value((QHttpHeaders *)in_RDI,
                                  (WellKnownHeader)((ulong)in_stack_ffffffffffffff70 >> 0x20),QVar4)
      ;
      oVar5 = QNetworkHeadersPrivate::toInt(QVar4);
      local_18._M_value =
           oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>._M_payload;
      local_10 = CONCAT71(local_10._1_7_,
                          oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
                          super__Optional_payload_base<long_long>._M_engaged);
      QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x1ea5a3);
      pauseNotificationHandling(in_RDI);
      QIODevice::readyRead();
      uVar1 = QElapsedTimer::isValid();
      if (((uVar1 & 1) != 0) && (lVar3 = QElapsedTimer::elapsed(), 99 < lVar3)) {
        QElapsedTimer::start();
        this_00 = (optional<long_long> *)in_RDI->bytesDownloaded;
        std::optional<long_long>::value_or<int>(this_00,(int *)__u);
        QNetworkReply::downloadProgress
                  ((QNetworkReply *)in_stack_ffffffffffffff58,(qint64)this_00,(qint64)__u);
      }
      resumeNotificationHandling(in_stack_ffffffffffffff70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::_q_copyReadyRead()
{
    Q_Q(QNetworkReplyImpl);
    if (state != Working)
        return;
    if (!copyDevice || !q->isOpen())
        return;

    // FIXME Optimize to use download buffer if it is a QBuffer.
    // Needs to be done where sendCacheContents() (?) of HTTP is emitting
    // metaDataChanged ?
    qint64 lastBytesDownloaded = bytesDownloaded;
    forever {
        qint64 bytesToRead = nextDownstreamBlockSize();
        if (bytesToRead == 0)
            // we'll be called again, eventually
            break;

        bytesToRead = qBound<qint64>(1, bytesToRead, copyDevice->bytesAvailable());
        qint64 bytesActuallyRead = copyDevice->read(buffer.reserve(bytesToRead), bytesToRead);
        if (bytesActuallyRead == -1) {
            buffer.chop(bytesToRead);
            break;
        }
        buffer.chop(bytesToRead - bytesActuallyRead);

        if (!copyDevice->isSequential() && copyDevice->atEnd()) {
            bytesDownloaded += bytesActuallyRead;
            break;
        }

        bytesDownloaded += bytesActuallyRead;
    }